

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O2

int xmlParse3986Segment(xmlURIPtr uri,char **str,char forbid,int empty)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  byte *cur;
  byte *cur_00;
  bool bVar4;
  
  cur = (byte *)*str;
  iVar1 = xmlIsUnreserved(uri,(char *)cur);
  bVar3 = *cur;
  if (((iVar1 == 0) &&
      ((uVar2 = bVar3 - 0x21, 0x1f < uVar2 ||
       (((0x96000fe9U >> (uVar2 & 0x1f) & 1) == 0 &&
        (((uVar2 != 4 ||
          ((9 < (byte)(cur[1] - 0x30) &&
           ((uVar2 = cur[1] - 0x41, 0x25 < uVar2 ||
            ((0x3f0000003fU >> ((ulong)uVar2 & 0x3f) & 1) == 0)))))) ||
         ((9 < (byte)(cur[2] - 0x30) &&
          ((uVar2 = cur[2] - 0x41, 0x25 < uVar2 ||
           ((0x3f0000003fU >> ((ulong)uVar2 & 0x3f) & 1) == 0)))))))))))) || (bVar3 == forbid)) {
    uVar2 = (uint)(empty == 0);
  }
  else {
    do {
      bVar4 = bVar3 == 0x25;
      cur_00 = cur + (ulong)bVar4 * 2 + 1;
      iVar1 = xmlIsUnreserved(uri,(char *)cur_00);
      bVar3 = *cur_00;
      if ((iVar1 == 0) &&
         ((uVar2 = bVar3 - 0x21, 0x1f < uVar2 ||
          (((0x96000fe9U >> (uVar2 & 0x1f) & 1) == 0 &&
           (((uVar2 != 4 ||
             ((9 < (byte)(cur[(ulong)bVar4 * 2 + 2] - 0x30) &&
              ((uVar2 = cur[(ulong)bVar4 * 2 + 2] - 0x41, 0x25 < uVar2 ||
               ((0x3f0000003fU >> ((ulong)uVar2 & 0x3f) & 1) == 0)))))) ||
            ((9 < (byte)(cur[(ulong)bVar4 * 2 + 3] - 0x30) &&
             ((uVar2 = cur[(ulong)bVar4 * 2 + 3] - 0x41, 0x25 < uVar2 ||
              ((0x3f0000003fU >> ((ulong)uVar2 & 0x3f) & 1) == 0)))))))))))) break;
      cur = cur_00;
    } while (bVar3 != forbid);
    *str = (char *)cur_00;
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

static int
xmlParse3986Segment(xmlURIPtr uri, const char **str, char forbid, int empty)
{
    const char *cur;

    cur = *str;
    if (!ISA_PCHAR(uri, cur) || (*cur == forbid)) {
        if (empty)
	    return(0);
	return(1);
    }
    NEXT(cur);

#if defined(_WIN32) || defined(__CYGWIN__)
    /*
     * Allow Windows drive letters.
     */
    if ((forbid == ':') && (*cur == forbid))
        NEXT(cur);
#endif

    while (ISA_PCHAR(uri, cur) && (*cur != forbid))
        NEXT(cur);
    *str = cur;
    return (0);
}